

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * Lowerer::GetMissingItemOpndForAssignment(IRType type,Func *func)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  ThreadContextInfo *this;
  intptr_t pMemLoc;
  MemRefOpnd *pMVar4;
  undefined4 *puVar5;
  Func *func_local;
  IRType type_local;
  
  if (type != TyInt32) {
    if (type == TyFloat64) {
      this = Func::GetThreadContextInfo(func);
      pMemLoc = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr(this);
      pMVar4 = IR::MemRefOpnd::New(pMemLoc,TyFloat64,func,AddrOpndKindDynamicMisc);
      return &pMVar4->super_Opnd;
    }
    if (type != TyVar) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4942,"(false)",
                         "Unexpected type in Lowerer::GetMissingItemOpndForAssignment");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  pOVar3 = GetMissingItemOpnd(type,func);
  return pOVar3;
}

Assistant:

IR::Opnd*
Lowerer::GetMissingItemOpndForAssignment(IRType type, Func *func)
{
    switch (type)
    {
    case TyVar:
    case TyInt32:
        return GetMissingItemOpnd(type, func);

    case TyFloat64:
        return IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetNativeFloatArrayMissingItemAddr(), TyFloat64, func);

    default:
        AnalysisAssertMsg(false, "Unexpected type in Lowerer::GetMissingItemOpndForAssignment");
        __assume(false);
    }
}